

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

CharClass * __thiscall re2::CharClass::Negate(CharClass *this)

{
  CharClass *pCVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  
  pCVar1 = New(*(int *)(this + 0x10) + 1);
  *pCVar1 = *this;
  *(int *)(pCVar1 + 4) = 0x110000 - *(int *)(this + 4);
  piVar3 = *(int **)(this + 8);
  iVar2 = 0;
  uVar6 = 0;
  piVar4 = piVar3;
  while( true ) {
    lVar5 = (long)iVar2;
    if (piVar3 == piVar4 + (long)*(int *)(this + 0x10) * 2) break;
    if (*piVar3 != (int)uVar6) {
      iVar2 = iVar2 + 1;
      *(ulong *)(*(long *)(pCVar1 + 8) + lVar5 * 8) = uVar6 | (ulong)(*piVar3 - 1) << 0x20;
      piVar4 = *(int **)(this + 8);
    }
    uVar6 = (ulong)(piVar3[1] + 1);
    piVar3 = piVar3 + 2;
  }
  if ((int)uVar6 < 0x110000) {
    iVar2 = iVar2 + 1;
    *(ulong *)(*(long *)(pCVar1 + 8) + lVar5 * 8) = uVar6 | 0x10ffff00000000;
  }
  *(int *)(pCVar1 + 0x10) = iVar2;
  return pCVar1;
}

Assistant:

CharClass* CharClass::Negate() {
  CharClass* cc = CharClass::New(nranges_+1);
  cc->folds_ascii_ = folds_ascii_;
  cc->nrunes_ = Runemax + 1 - nrunes_;
  int n = 0;
  int nextlo = 0;
  for (CharClass::iterator it = begin(); it != end(); ++it) {
    if (it->lo == nextlo) {
      nextlo = it->hi + 1;
    } else {
      cc->ranges_[n++] = RuneRange(nextlo, it->lo - 1);
      nextlo = it->hi + 1;
    }
  }
  if (nextlo <= Runemax)
    cc->ranges_[n++] = RuneRange(nextlo, Runemax);
  cc->nranges_ = n;
  return cc;
}